

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::OutputFile::setFrameBuffer(OutputFile *this,FrameBuffer *frameBuffer)

{
  int iVar1;
  PixelType PVar2;
  size_t xs;
  size_t ys;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined8 uVar6;
  Channel *pCVar7;
  Slice *pSVar8;
  ConstIterator j_1;
  ConstIterator i_1;
  vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
  slices;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  ConstIterator j;
  ConstIterator i;
  ChannelList *channels;
  lock_guard<std::mutex> lock;
  int in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  undefined4 in_stack_fffffffffffffa40;
  int in_stack_fffffffffffffa44;
  const_iterator in_stack_fffffffffffffac8;
  const_iterator in_stack_fffffffffffffad0;
  char *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  OutSliceInfo local_3f8;
  OutSliceInfo local_3c8;
  const_iterator local_398;
  const_iterator local_390;
  const_iterator local_388;
  const_iterator local_380;
  stringstream local_360 [16];
  ostream local_350 [376];
  stringstream local_1d8 [16];
  ostream local_1c8 [376];
  const_iterator local_50;
  const_iterator local_48;
  const_iterator local_40;
  const_iterator local_38;
  ChannelList *local_20;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30)
             ,(mutex_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  local_20 = Header::channels((Header *)0xa3f040);
  local_38._M_node =
       (_Base_ptr)
       ChannelList::begin((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  do {
    local_40._M_node =
         (_Base_ptr)
         ChannelList::end((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    bVar3 = Imf_3_3::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    if (!bVar3) {
      std::
      vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
      ::vector((vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
                *)0xa3f58d);
      local_380._M_node =
           (_Base_ptr)
           ChannelList::begin((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      while( true ) {
        local_388._M_node =
             (_Base_ptr)
             ChannelList::end((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        bVar3 = Imf_3_3::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        if (!bVar3) break;
        ChannelList::ConstIterator::name((ConstIterator *)0xa3f626);
        in_stack_fffffffffffffad0._M_node =
             (_Base_ptr)
             FrameBuffer::find((FrameBuffer *)
                               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                               in_stack_fffffffffffffb30);
        local_390._M_node = in_stack_fffffffffffffad0._M_node;
        in_stack_fffffffffffffac8._M_node =
             (_Base_ptr)
             FrameBuffer::end((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        local_398._M_node = in_stack_fffffffffffffac8._M_node;
        bVar3 = Imf_3_3::operator==((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        if (bVar3) {
          pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0xa3f6c1);
          PVar2 = pCVar7->type;
          pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0xa3f6e9);
          iVar1 = pCVar7->xSampling;
          pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0xa3f70f);
          in_stack_fffffffffffffa28 = pCVar7->ySampling;
          in_stack_fffffffffffffa30 = 1;
          anon_unknown_6::OutSliceInfo::OutSliceInfo
                    (&local_3c8,PVar2,(char *)0x0,0,0,iVar1,in_stack_fffffffffffffa28,true);
          std::
          vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
          ::push_back((vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
                       *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                      (value_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        }
        else {
          pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa3f79f);
          PVar2 = pSVar8->type;
          pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa3f7be);
          pcVar5 = pSVar8->base;
          pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa3f7e0);
          xs = pSVar8->xStride;
          pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa3f802);
          ys = pSVar8->yStride;
          pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa3f824);
          in_stack_fffffffffffffa44 = pSVar8->xSampling;
          pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa3f844);
          in_stack_fffffffffffffa28 = pSVar8->ySampling;
          in_stack_fffffffffffffa30 = 0;
          anon_unknown_6::OutSliceInfo::OutSliceInfo
                    (&local_3f8,PVar2,pcVar5,xs,ys,in_stack_fffffffffffffa44,
                     in_stack_fffffffffffffa28,false);
          std::
          vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
          ::push_back((vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
                       *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                      (value_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        }
        ChannelList::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
      }
      FrameBuffer::operator=
                ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 (FrameBuffer *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      std::
      vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
      ::operator=((vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
                   *)in_stack_fffffffffffffad0._M_node,
                  (vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
                   *)in_stack_fffffffffffffac8._M_node);
      std::
      vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
      ::~vector((vector<Imf_3_3::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::OutSliceInfo>_>
                 *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xa3f910);
      return;
    }
    ChannelList::ConstIterator::name((ConstIterator *)0xa3f0f3);
    local_48._M_node =
         (_Base_ptr)
         FrameBuffer::find((FrameBuffer *)
                           CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                           in_stack_fffffffffffffb30);
    local_50._M_node =
         (_Base_ptr)
         FrameBuffer::end((FrameBuffer *)
                          CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    bVar3 = Imf_3_3::operator==((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    if (!bVar3) {
      pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0xa3f1a9);
      PVar2 = pCVar7->type;
      pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa3f1d1);
      if (PVar2 != pSVar8->type) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1d8);
        poVar4 = std::operator<<(local_1c8,"Pixel type of \"");
        pcVar5 = ChannelList::ConstIterator::name((ConstIterator *)0xa3f235);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\" channel of output file \"");
        pcVar5 = fileName((OutputFile *)0xa3f289);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::operator<<(poVar4,"\" is not compatible with the frame buffer\'s pixel type.");
        uVar6 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                   (stringstream *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        __cxa_throw(uVar6,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0xa3f365);
      iVar1 = pCVar7->xSampling;
      pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa3f38e);
      if (iVar1 != pSVar8->xSampling) {
LAB_00a3f404:
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_360);
        poVar4 = std::operator<<(local_350,"X and/or y subsampling factors of \"");
        pcVar5 = ChannelList::ConstIterator::name((ConstIterator *)0xa3f447);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\" channel of output file \"");
        pcVar5 = fileName((OutputFile *)0xa3f49b);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::operator<<(poVar4,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        uVar6 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                   (stringstream *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        __cxa_throw(uVar6,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0xa3f3b9);
      in_stack_fffffffffffffb3c = pCVar7->ySampling;
      pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa3f3e2);
      if (in_stack_fffffffffffffb3c != pSVar8->ySampling) goto LAB_00a3f404;
    }
    ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  } while( true );
}

Assistant:

void
OutputFile::setFrameBuffer (const FrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        FrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ()) continue;

        if (i.channel ().type != j.slice ().type)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Pixel type of \"" << i.name ()
                                   << "\" channel "
                                      "of output file \""
                                   << fileName ()
                                   << "\" is "
                                      "not compatible with the frame buffer's "
                                      "pixel type.");
        }

        if (i.channel ().xSampling != j.slice ().xSampling ||
            i.channel ().ySampling != j.slice ().ySampling)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << i.name ()
                    << "\" channel "
                       "of output file \""
                    << fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
        }
    }

    //
    // Initialize slice table for writePixels().
    //

    vector<OutSliceInfo> slices;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        FrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (OutSliceInfo (
                i.channel ().type,
                0, // base
                0, // xStride,
                0, // yStride,
                i.channel ().xSampling,
                i.channel ().ySampling,
                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (OutSliceInfo (
                j.slice ().type,
                j.slice ().base,
                j.slice ().xStride,
                j.slice ().yStride,
                j.slice ().xSampling,
                j.slice ().ySampling,
                false)); // zero
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices      = slices;
}